

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# left_objects_detector.cpp
# Opt level: O0

void __thiscall
feintrack::SimpleLeftObjectsDetector::add_left_object_to_out_rects
          (SimpleLeftObjectsDetector *this,CLeftObjView *left_obj,types type,
          VideoHeader *videoHeader)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  types tVar4;
  ulong uVar5;
  size_type sVar6;
  reference pvVar7;
  CLeftObjRect local_40;
  VideoHeader *local_28;
  VideoHeader *videoHeader_local;
  CLeftObjView *pCStack_18;
  types type_local;
  CLeftObjView *left_obj_local;
  SimpleLeftObjectsDetector *this_local;
  
  uVar5 = this->left_objects_count + 1;
  this->left_objects_count = uVar5;
  local_28 = videoHeader;
  videoHeader_local._4_4_ = type;
  pCStack_18 = left_obj;
  left_obj_local = (CLeftObjView *)this;
  sVar6 = std::vector<feintrack::CLeftObjRect,_std::allocator<feintrack::CLeftObjRect>_>::size
                    (&this->left_obj_rects);
  if (sVar6 < uVar5) {
    CLeftObjRect::CLeftObjRect
              (&local_40,&pCStack_18->rect,videoHeader_local._4_4_,pCStack_18->obj_uid);
    std::vector<feintrack::CLeftObjRect,_std::allocator<feintrack::CLeftObjRect>_>::push_back
              (&this->left_obj_rects,&local_40);
    if (local_28->left_padding != 0) {
      iVar1 = local_28->left_padding;
      pvVar7 = std::vector<feintrack::CLeftObjRect,_std::allocator<feintrack::CLeftObjRect>_>::
               operator[](&this->left_obj_rects,this->left_objects_count - 1);
      (pvVar7->super_RECT_).left = iVar1 + (pvVar7->super_RECT_).left;
      iVar1 = local_28->left_padding;
      pvVar7 = std::vector<feintrack::CLeftObjRect,_std::allocator<feintrack::CLeftObjRect>_>::
               operator[](&this->left_obj_rects,this->left_objects_count - 1);
      (pvVar7->super_RECT_).right = iVar1 + (pvVar7->super_RECT_).right;
    }
    if (local_28->top_padding != 0) {
      iVar1 = local_28->top_padding;
      pvVar7 = std::vector<feintrack::CLeftObjRect,_std::allocator<feintrack::CLeftObjRect>_>::
               operator[](&this->left_obj_rects,this->left_objects_count - 1);
      (pvVar7->super_RECT_).top = iVar1 + (pvVar7->super_RECT_).top;
      iVar1 = local_28->top_padding;
      pvVar7 = std::vector<feintrack::CLeftObjRect,_std::allocator<feintrack::CLeftObjRect>_>::
               operator[](&this->left_obj_rects,this->left_objects_count - 1);
      (pvVar7->super_RECT_).bottom = iVar1 + (pvVar7->super_RECT_).bottom;
    }
  }
  else {
    iVar1 = (pCStack_18->rect).left;
    iVar2 = local_28->left_padding;
    pvVar7 = std::vector<feintrack::CLeftObjRect,_std::allocator<feintrack::CLeftObjRect>_>::
             operator[](&this->left_obj_rects,this->left_objects_count - 1);
    (pvVar7->super_RECT_).left = iVar1 + iVar2;
    iVar1 = (pCStack_18->rect).right;
    iVar2 = local_28->left_padding;
    pvVar7 = std::vector<feintrack::CLeftObjRect,_std::allocator<feintrack::CLeftObjRect>_>::
             operator[](&this->left_obj_rects,this->left_objects_count - 1);
    (pvVar7->super_RECT_).right = iVar1 + iVar2;
    iVar1 = (pCStack_18->rect).top;
    iVar2 = local_28->top_padding;
    pvVar7 = std::vector<feintrack::CLeftObjRect,_std::allocator<feintrack::CLeftObjRect>_>::
             operator[](&this->left_obj_rects,this->left_objects_count - 1);
    (pvVar7->super_RECT_).top = iVar1 + iVar2;
    iVar1 = (pCStack_18->rect).bottom;
    iVar2 = local_28->top_padding;
    pvVar7 = std::vector<feintrack::CLeftObjRect,_std::allocator<feintrack::CLeftObjRect>_>::
             operator[](&this->left_obj_rects,this->left_objects_count - 1);
    tVar4 = videoHeader_local._4_4_;
    (pvVar7->super_RECT_).bottom = iVar1 + iVar2;
    pvVar7 = std::vector<feintrack::CLeftObjRect,_std::allocator<feintrack::CLeftObjRect>_>::
             operator[](&this->left_obj_rects,this->left_objects_count - 1);
    pvVar7->type = tVar4;
    uVar3 = pCStack_18->obj_uid;
    pvVar7 = std::vector<feintrack::CLeftObjRect,_std::allocator<feintrack::CLeftObjRect>_>::
             operator[](&this->left_obj_rects,this->left_objects_count - 1);
    pvVar7->obj_uid = uVar3;
  }
  return;
}

Assistant:

void SimpleLeftObjectsDetector::add_left_object_to_out_rects(
        const CLeftObjView &left_obj,
        CLeftObjRect::types type,
        const VideoHeader& videoHeader
        )
{
    // Здесь сделана попытка избежать лишних выделений памяти: массив left_obj_rects никогда не уменьшается
    // Он может только увеличивать свой размер, если на последующих кадрах выделенных объектов больше, чем на предыдущих
    if (++left_objects_count > left_obj_rects.size())
    {
        left_obj_rects.push_back(CLeftObjRect(left_obj.rect, type, left_obj.obj_uid));
        if (videoHeader.left_padding)
        {
            left_obj_rects[left_objects_count - 1].left += videoHeader.left_padding;
            left_obj_rects[left_objects_count - 1].right += videoHeader.left_padding;
        }
        if (videoHeader.top_padding)
        {
            left_obj_rects[left_objects_count - 1].top += videoHeader.top_padding;
            left_obj_rects[left_objects_count - 1].bottom += videoHeader.top_padding;
        }
    }
    else
    {
        left_obj_rects[left_objects_count - 1].left = left_obj.rect.left + videoHeader.left_padding;
        left_obj_rects[left_objects_count - 1].right = left_obj.rect.right + videoHeader.left_padding;
        left_obj_rects[left_objects_count - 1].top = left_obj.rect.top + videoHeader.top_padding;
        left_obj_rects[left_objects_count - 1].bottom = left_obj.rect.bottom + videoHeader.top_padding;
        left_obj_rects[left_objects_count - 1].type = type;
        left_obj_rects[left_objects_count - 1].obj_uid = left_obj.obj_uid;
    }
}